

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache.cc
# Opt level: O0

bool __thiscall
ctemplate::TemplateCache::TemplateIsCached(TemplateCache *this,TemplateCacheKey template_cache_key)

{
  size_type sVar1;
  ReaderMutexLock local_28;
  ReaderMutexLock ml;
  TemplateCache *this_local;
  TemplateCacheKey template_cache_key_local;
  
  this_local = (TemplateCache *)template_cache_key.first;
  template_cache_key_local.first._0_4_ = template_cache_key.second;
  ml.mu_ = (Mutex *)this;
  ReaderMutexLock::ReaderMutexLock(&local_28,this->mutex_);
  sVar1 = std::
          unordered_map<std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate,_ctemplate::TemplateCache::TemplateCacheHash,_std::equal_to<std::pair<unsigned_long,_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_int>,_ctemplate::TemplateCache::CachedTemplate>_>_>
          ::count(this->parsed_template_cache_,(key_type *)&this_local);
  ReaderMutexLock::~ReaderMutexLock(&local_28);
  return sVar1 != 0;
}

Assistant:

bool TemplateCache::TemplateIsCached(const TemplateCacheKey template_cache_key)
    const {
  ReaderMutexLock ml(mutex_);
  return parsed_template_cache_->count(template_cache_key);
}